

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

void __thiscall AmpIO::InitWriteBuffer(AmpIO *this)

{
  byte bVar1;
  uint32_t uVar2;
  ulong local_20;
  size_t i;
  quadlet_t data;
  AmpIO *this_local;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 8) {
    this->WB_CURR_OFFSET = 0;
    this->WB_CTRL_OFFSET = this->WB_CURR_OFFSET + this->NumMotors;
    bVar1 = (this->super_FpgaIO).super_BoardIO.BoardId;
    for (local_20 = 0; local_20 < this->NumMotors; local_20 = local_20 + 1) {
      this->WriteBuffer[this->WB_CURR_OFFSET + local_20] = (bVar1 & 0xf) << 0x18;
    }
    this->WriteBuffer[this->WB_CTRL_OFFSET] = 0;
  }
  else {
    this->WB_CURR_OFFSET = 1;
    this->WB_CTRL_OFFSET = this->WB_CURR_OFFSET + this->NumMotors;
    memset(this->WriteBuffer,0,0x100);
    this->WriteBuffer[this->WB_HEADER_OFFSET] =
         ((this->super_FpgaIO).super_BoardIO.BoardId & 0xf) << 8 | this->NumMotors + 2 & 0xff;
  }
  return;
}

Assistant:

void AmpIO::InitWriteBuffer(void)
{
    if (GetFirmwareVersion() < 8) {
        WB_CURR_OFFSET = 0;
        WB_CTRL_OFFSET = WB_CURR_OFFSET + NumMotors;
        quadlet_t data = (BoardId & 0x0F) << 24;
        for (size_t i = 0; i < NumMotors; i++) {
            WriteBuffer[WB_CURR_OFFSET+i] = data;
        }
        WriteBuffer[WB_CTRL_OFFSET] = 0;
    } else {
        WB_CURR_OFFSET = 1;
        WB_CTRL_OFFSET = WB_CURR_OFFSET + NumMotors;
        //std::fill(std::begin(WriteBuffer), std::end(WriteBuffer), 0);
        memset(WriteBuffer, 0, sizeof(WriteBuffer));
        // Write buffer size = NumMotors+2 (quadlets)
        WriteBuffer[WB_HEADER_OFFSET] = (BoardId & 0x0F) << 8 | ((NumMotors+2) & 0xFF);
    }
}